

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  char *pcVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  BYTE *s;
  long *plVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  int *piVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  long *plVar17;
  long lVar18;
  ulong *puVar19;
  short *psVar20;
  int iVar21;
  BYTE *s_3;
  ulong uVar22;
  int iVar23;
  long lVar24;
  int *piVar25;
  uint uVar26;
  short *__s;
  short *psVar27;
  ulong uVar28;
  ulong uVar29;
  char *pcVar30;
  int *unaff_R12;
  uint uVar31;
  BYTE *e_1;
  BYTE *d;
  char *pcVar32;
  int *unaff_R15;
  BYTE *e;
  char *pcVar33;
  U16 *hashTable;
  long *local_b8;
  long *local_b0;
  ulong local_98;
  
  iVar21 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
    unaff_R15 = (int *)state;
  }
  else {
    state = (void *)0x0;
  }
  iVar9 = 1;
  if (1 < acceleration) {
    iVar9 = acceleration;
  }
  if (0x10000 < iVar9) {
    iVar9 = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar21 = (uint)((ulong)(uint)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  iVar23 = (int)dest;
  if (maxOutputSize < iVar21) {
    local_b0 = (long *)source;
    local_b8 = (long *)dest;
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize != 0) {
        uVar31 = *(uint *)((long)state + 0x4010);
        pcVar30 = dest + maxOutputSize;
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4010) = uVar31 + inputSize;
        *(undefined4 *)((long)state + 0x4014) = 3;
        if (0xc < inputSize) {
          lVar18 = (long)source - (ulong)uVar31;
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar31;
          piVar25 = (int *)(source + 1);
          uVar31 = (uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13;
          do {
            uVar22 = 1;
            piVar13 = piVar25;
            uVar16 = iVar9 << 6;
            do {
              piVar25 = piVar13;
              piVar13 = (int *)(uVar22 + (long)piVar25);
              sVar4 = (short)lVar18;
              if (source + ((ulong)(uint)inputSize - 0xb) < piVar13) {
                iVar21 = 2;
              }
              else {
                uVar22 = (ulong)*(ushort *)((long)state + (ulong)uVar31 * 2);
                iVar5 = *piVar13;
                *(short *)((long)state + (ulong)uVar31 * 2) = (short)piVar25 - sVar4;
                iVar21 = 7;
                if (*(int *)(lVar18 + uVar22) != *piVar25) {
                  iVar21 = 0;
                }
                unaff_R12 = (int *)(uVar22 + lVar18);
                uVar31 = (uint)(iVar5 * -0x61c8864f) >> 0x13;
              }
              uVar22 = (ulong)(uVar16 >> 6);
              uVar16 = uVar16 + 1;
            } while (iVar21 == 0);
            if (iVar21 == 7) {
              iVar21 = 0;
            }
            dest = (char *)local_b8;
            if (iVar21 == 0) {
              if ((source < unaff_R12) &&
                 (piVar13 = piVar25, piVar7 = unaff_R12,
                 *(char *)((long)piVar25 + -1) == *(char *)((long)unaff_R12 + -1))) {
                while( true ) {
                  unaff_R12 = (int *)((long)piVar7 + -1);
                  piVar25 = (int *)((long)piVar13 + -1);
                  if (unaff_R12 <= source) break;
                  if ((piVar25 <= local_b0) ||
                     (pcVar32 = (char *)((long)piVar13 + -2), pcVar33 = (char *)((long)piVar7 + -2),
                     piVar13 = piVar25, piVar7 = unaff_R12, *pcVar32 != *pcVar33)) break;
                }
              }
              uVar22 = (long)piVar25 - (long)local_b0;
              dest = (char *)((long)local_b8 + 1);
              uVar14 = uVar22 & 0xffffffff;
              pcVar32 = (char *)((long)local_b8 + uVar14 / 0xff + uVar14 + 9);
              if (pcVar30 < pcVar32) {
                iVar21 = 1;
              }
              else {
                if ((uint)uVar22 < 0xf) {
                  *(char *)local_b8 = (char)uVar22 << 4;
                  psVar27 = (short *)dest;
                }
                else {
                  uVar16 = (uint)uVar22 - 0xf;
                  *(char *)local_b8 = -0x10;
                  if (0xfe < uVar16) {
                    memset(dest,0xff,
                           (ulong)(uint)(((int)piVar25 + -0x10e) - (int)local_b0) / 0xff + 1);
                    iVar21 = (int)piVar25 - (int)local_b0;
                    uVar16 = iVar21 - 0x10e;
                    dest = (char *)((long)local_b8 + (ulong)uVar16 / 0xff + 2);
                    uVar16 = (iVar21 + (uVar16 / 0xff) * -0xff) - 0x10e;
                  }
                  *dest = (char)uVar16;
                  psVar27 = (short *)((long)dest + 1);
                }
                dest = (char *)(uVar14 + (long)psVar27);
                plVar6 = local_b0;
                do {
                  *(long *)psVar27 = *plVar6;
                  psVar27 = psVar27 + 4;
                  plVar6 = (long *)((long)plVar6 + 8);
                } while (psVar27 < dest);
                iVar21 = 0;
              }
              psVar27 = (short *)dest;
              if (pcVar32 <= pcVar30) {
                do {
                  *psVar27 = (short)piVar25 - (short)unaff_R12;
                  puVar1 = (ulong *)(piVar25 + 1);
                  puVar19 = (ulong *)(unaff_R12 + 1);
                  puVar15 = puVar1;
                  if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
                    uVar14 = *(ulong *)(piVar25 + 1) ^ *(ulong *)(unaff_R12 + 1);
                    uVar22 = 0;
                    if (uVar14 != 0) {
                      for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = uVar22 >> 3 & 0x1fffffff;
                    puVar15 = (ulong *)(piVar25 + 3);
                    puVar19 = (ulong *)(unaff_R12 + 3);
                    if (*(ulong *)(unaff_R12 + 1) == *(ulong *)(piVar25 + 1)) goto LAB_0014ea43;
                  }
                  else {
LAB_0014ea43:
                    do {
                      if (source + ((ulong)(uint)inputSize - 0xc) <= puVar15) {
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                           ((int)*puVar19 == (int)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 4);
                          puVar19 = (ulong *)((long)puVar19 + 4);
                        }
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                           ((short)*puVar19 == (short)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 2);
                          puVar19 = (ulong *)((long)puVar19 + 2);
                        }
                        if (puVar15 < source + ((ulong)(uint)inputSize - 5)) {
                          puVar15 = (ulong *)((long)puVar15 +
                                             (ulong)((char)*puVar19 == (char)*puVar15));
                        }
                        uVar22 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                        goto LAB_0014ea80;
                      }
                      uVar22 = *puVar19;
                      uVar14 = *puVar15;
                      uVar29 = uVar14 ^ uVar22;
                      uVar11 = 0;
                      if (uVar29 != 0) {
                        for (; (uVar29 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                        }
                      }
                      iVar21 = (int)puVar15;
                      puVar19 = puVar19 + 1;
                      puVar15 = puVar15 + 1;
                    } while (uVar22 == uVar14);
                    uVar22 = (ulong)((((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21) - (int)puVar1);
                  }
LAB_0014ea80:
                  dest = (char *)(psVar27 + 1);
                  uVar16 = (uint)uVar22;
                  pcVar32 = (char *)((long)psVar27 + (ulong)(uVar16 + 0xf0) / 0xff + 8);
                  if (pcVar32 <= pcVar30) {
                    if (uVar16 < 0xf) {
                      *(char *)local_b8 = (char)*local_b8 + (char)uVar22;
                    }
                    else {
                      *(char *)local_b8 = (char)*local_b8 + '\x0f';
                      uVar26 = uVar16 - 0xf;
                      *(short *)((long)dest + 0) = -1;
                      *(short *)((long)dest + 2) = -1;
                      if (0x3fb < uVar26) {
                        uVar16 = uVar16 - 0x40b;
                        memset(psVar27 + 3,0xff,(ulong)((uVar16 / 0x3fc) * 4 + 4));
                        uVar26 = uVar16 % 0x3fc;
                        dest = (char *)((long)psVar27 + (ulong)((uVar16 / 0x3fc) * 4) + 6);
                      }
                      pcVar33 = (char *)((long)dest + (ulong)uVar26 / 0xff);
                      dest = pcVar33 + 1;
                      *pcVar33 = (char)(uVar26 / 0xff) + (char)uVar26;
                    }
                  }
                  lVar24 = (long)piVar25 + uVar22;
                  piVar25 = (int *)(lVar24 + 4);
                  if (pcVar30 < pcVar32) {
                    iVar21 = 1;
                    goto LAB_0014ec6c;
                  }
                  local_b0 = (long *)piVar25;
                  if (source + ((ulong)(uint)inputSize - 0xb) <= piVar25) {
                    iVar21 = 3;
                    goto LAB_0014ec6c;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar24 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar24 + 2) - sVar4;
                  iVar21 = *piVar25;
                  uVar22 = (ulong)((uint)(iVar21 * -0x61c8864f) >> 0x13);
                  uVar14 = (ulong)*(ushort *)((long)state + uVar22 * 2);
                  *(short *)((long)state + uVar22 * 2) = (short)piVar25 - sVar4;
                  iVar5 = *(int *)(lVar18 + uVar14);
                  psVar27 = (short *)dest;
                  if (iVar5 == iVar21) {
                    *dest = '\0';
                    psVar27 = (short *)((long)dest + 1);
                    local_b8 = (long *)dest;
                  }
                  dest = (char *)psVar27;
                  unaff_R12 = (int *)(uVar14 + lVar18);
                  psVar27 = (short *)dest;
                } while (iVar5 == iVar21);
                piVar25 = (int *)(lVar24 + 5);
                uVar31 = (uint)(*(int *)(lVar24 + 5) * -0x61c8864f) >> 0x13;
                iVar21 = 0;
              }
            }
LAB_0014ec6c:
            local_b8 = (long *)dest;
          } while (iVar21 == 0);
          if (1 < iVar21 - 2U) {
            return 0;
          }
        }
        pcVar33 = source + ((ulong)(uint)inputSize - (long)local_b0);
        pcVar32 = (char *)((long)dest + (long)(pcVar33 + (ulong)(pcVar33 + 0xf0) / 0xff + 1));
        if (pcVar32 <= pcVar30) {
          if (pcVar33 < (char *)0xf) {
            *dest = (char)pcVar33 << 4;
          }
          else {
            pcVar8 = pcVar33 + -0xf;
            *dest = -0x10;
            psVar27 = (short *)((long)dest + 1);
            if ((char *)0xfe < pcVar8) {
              uVar22 = (ulong)(pcVar33 + -0x10e) / 0xff;
              memset((short *)((long)dest + 1),0xff,uVar22 + 1);
              pcVar8 = pcVar33 + uVar22 * -0xff + -0x10e;
              psVar27 = (short *)((long)dest + uVar22 + 2);
            }
            dest = (char *)psVar27;
            *dest = (char)pcVar8;
          }
          memcpy((char *)((long)dest + 1),local_b0,(size_t)pcVar33);
          dest = (char *)((long)dest + (long)(pcVar33 + 1));
        }
        if (pcVar32 <= pcVar30) {
          return (int)dest - iVar23;
        }
        return 0;
      }
      if (maxOutputSize < 1) {
        return 0;
      }
LAB_0014e74a:
      *dest = '\0';
      return 1;
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    uVar31 = *(uint *)((long)state + 0x4010);
    lVar18 = (long)source - (ulong)uVar31;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    pcVar30 = dest + maxOutputSize;
    *(uint *)((long)state + 0x4010) = inputSize + uVar31;
    *(undefined4 *)((long)state + 0x4014) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar31;
    plVar6 = (long *)(source + 1);
    uVar22 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
    do {
      uVar14 = 1;
      uVar31 = iVar9 << 6;
      while( true ) {
        plVar10 = (long *)(uVar14 + (long)plVar6);
        iVar21 = (int)lVar18;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar10) {
          iVar5 = 2;
        }
        else {
          uVar16 = *(uint *)((long)state + uVar22 * 4);
          uVar26 = (int)plVar6 - iVar21;
          unaff_R12 = (int *)((ulong)uVar16 + lVar18);
          uVar14 = (ulong)(*plVar10 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)state + uVar22 * 4) = uVar26;
          iVar5 = 8;
          uVar22 = uVar14;
          if ((uVar26 <= uVar16 + 0xffff) && (iVar5 = 7, *unaff_R12 != (int)*plVar6)) {
            iVar5 = 0;
          }
        }
        if ((iVar5 != 0) && (iVar5 != 8)) break;
        uVar14 = (ulong)(uVar31 >> 6);
        uVar31 = uVar31 + 1;
        plVar6 = plVar10;
      }
      if (iVar5 == 7) {
        iVar5 = 0;
      }
      plVar10 = local_b8;
      if (iVar5 == 0) {
        if ((source < unaff_R12) &&
           (plVar10 = plVar6, piVar25 = unaff_R12,
           *(char *)((long)plVar6 + -1) == *(char *)((long)unaff_R12 + -1))) {
          while( true ) {
            unaff_R12 = (int *)((long)piVar25 + -1);
            plVar6 = (long *)((long)plVar10 + -1);
            if (unaff_R12 <= source) break;
            if ((plVar6 <= local_b0) ||
               (pcVar32 = (char *)((long)plVar10 + -2), pcVar33 = (char *)((long)piVar25 + -2),
               plVar10 = plVar6, piVar25 = unaff_R12, *pcVar32 != *pcVar33)) break;
          }
        }
        uVar14 = (long)plVar6 - (long)local_b0;
        plVar10 = (long *)((long)local_b8 + 1);
        uVar11 = uVar14 & 0xffffffff;
        pcVar32 = (char *)((long)local_b8 + uVar11 / 0xff + uVar11 + 9);
        if (pcVar30 < pcVar32) {
          iVar5 = 1;
        }
        else {
          if ((uint)uVar14 < 0xf) {
            *(char *)local_b8 = (char)uVar14 << 4;
            plVar12 = plVar10;
          }
          else {
            uVar31 = (uint)uVar14 - 0xf;
            *(char *)local_b8 = -0x10;
            if (0xfe < uVar31) {
              memset(plVar10,0xff,(ulong)(uint)(((int)plVar6 + -0x10e) - (int)local_b0) / 0xff + 1);
              iVar5 = (int)plVar6 - (int)local_b0;
              uVar31 = iVar5 - 0x10e;
              plVar10 = (long *)((long)local_b8 + (ulong)uVar31 / 0xff + 2);
              uVar31 = (iVar5 + (uVar31 / 0xff) * -0xff) - 0x10e;
            }
            *(char *)plVar10 = (char)uVar31;
            plVar12 = (long *)((long)plVar10 + 1);
          }
          plVar10 = (long *)(uVar11 + (long)plVar12);
          plVar17 = local_b0;
          do {
            *plVar12 = *plVar17;
            plVar12 = plVar12 + 1;
            plVar17 = plVar17 + 1;
          } while (plVar12 < plVar10);
          iVar5 = 0;
        }
        if (pcVar32 <= pcVar30) {
          do {
            *(short *)plVar10 = (short)plVar6 - (short)unaff_R12;
            puVar1 = (ulong *)((long)plVar6 + 4);
            puVar19 = (ulong *)(unaff_R12 + 1);
            puVar15 = puVar1;
            if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
              uVar11 = *(ulong *)((long)plVar6 + 4) ^ *(ulong *)(unaff_R12 + 1);
              uVar14 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
              puVar15 = (ulong *)((long)plVar6 + 0xc);
              puVar19 = (ulong *)(unaff_R12 + 3);
              if (*(ulong *)(unaff_R12 + 1) == *(ulong *)((long)plVar6 + 4)) goto LAB_0014df8e;
            }
            else {
LAB_0014df8e:
              do {
                if (source + ((ulong)(uint)inputSize - 0xc) <= puVar15) {
                  if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar19 == (int)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar19 == (short)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar15 < source + ((ulong)(uint)inputSize - 5)) {
                    puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
                  }
                  uVar14 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                  goto LAB_0014dfcb;
                }
                uVar14 = *puVar19;
                uVar11 = *puVar15;
                uVar28 = uVar11 ^ uVar14;
                uVar29 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                iVar5 = (int)puVar15;
                puVar19 = puVar19 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar14 == uVar11);
              uVar14 = (ulong)((((uint)(uVar29 >> 3) & 0x1fffffff) + iVar5) - (int)puVar1);
            }
LAB_0014dfcb:
            plVar12 = (long *)((long)plVar10 + 2);
            uVar31 = (uint)uVar14;
            pcVar32 = (char *)((long)plVar10 + (ulong)(uVar31 + 0xf0) / 0xff + 8);
            if (pcVar32 <= pcVar30) {
              if (uVar31 < 0xf) {
                *(char *)local_b8 = (char)*local_b8 + (char)uVar14;
              }
              else {
                *(char *)local_b8 = (char)*local_b8 + '\x0f';
                uVar16 = uVar31 - 0xf;
                *(undefined4 *)plVar12 = 0xffffffff;
                if (0x3fb < uVar16) {
                  uVar31 = uVar31 - 0x40b;
                  memset((char *)((long)plVar10 + 6),0xff,(ulong)((uVar31 / 0x3fc) * 4 + 4));
                  uVar16 = uVar31 % 0x3fc;
                  plVar12 = (long *)((long)plVar10 + (ulong)((uVar31 / 0x3fc) * 4) + 6);
                }
                pcVar33 = (char *)((long)plVar12 + (ulong)uVar16 / 0xff);
                plVar12 = (long *)(pcVar33 + 1);
                *pcVar33 = (char)(uVar16 / 0xff) + (char)uVar16;
              }
            }
            lVar24 = uVar14 + (long)plVar6;
            plVar6 = (long *)(lVar24 + 4);
            plVar10 = plVar12;
            if (pcVar30 < pcVar32) {
              iVar5 = 1;
              goto LAB_0014e1d4;
            }
            local_b0 = plVar6;
            if (source + ((ulong)(uint)inputSize - 0xb) <= plVar6) {
              iVar5 = 3;
              goto LAB_0014e1d4;
            }
            *(int *)((long)state +
                    ((ulong)(*(long *)(lVar24 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)lVar24 + 2) - iVar21;
            uVar14 = (ulong)(*plVar6 * -0x30e4432345000000) >> 0x34;
            uVar16 = (int)plVar6 - iVar21;
            uVar31 = *(uint *)((long)state + uVar14 * 4);
            unaff_R12 = (int *)((ulong)uVar31 + lVar18);
            *(uint *)((long)state + uVar14 * 4) = uVar16;
            bVar3 = true;
            if ((uVar16 <= uVar31 + 0xffff) && (*unaff_R12 == *(int *)plVar6)) {
              *(char *)plVar12 = '\0';
              bVar3 = false;
              plVar10 = (long *)((long)plVar12 + 1);
              local_b8 = plVar12;
            }
          } while (!bVar3);
          plVar6 = (long *)(lVar24 + 5);
          uVar22 = (ulong)(*(long *)(lVar24 + 5) * -0x30e4432345000000) >> 0x34;
          iVar5 = 0;
        }
      }
LAB_0014e1d4:
      local_b8 = plVar10;
    } while (iVar5 == 0);
    if (iVar5 - 2U < 2) {
      pcVar33 = source + ((ulong)(uint)inputSize - (long)local_b0);
      pcVar32 = (char *)((long)local_b8 + (long)(pcVar33 + (ulong)(pcVar33 + 0xf0) / 0xff + 1));
      if (pcVar30 < pcVar32) {
        iVar21 = (int)local_b8;
      }
      else {
        if (pcVar33 < (char *)0xf) {
          *(char *)local_b8 = (char)pcVar33 << 4;
        }
        else {
          pcVar8 = pcVar33 + -0xf;
          *(char *)local_b8 = -0x10;
          plVar6 = (long *)((long)local_b8 + 1);
          if ((char *)0xfe < pcVar8) {
            uVar22 = (ulong)(pcVar33 + -0x10e) / 0xff;
            memset((long *)((long)local_b8 + 1),0xff,uVar22 + 1);
            pcVar8 = pcVar33 + uVar22 * -0xff + -0x10e;
            plVar6 = (long *)((long)local_b8 + uVar22 + 2);
          }
          local_b8 = plVar6;
          *(char *)local_b8 = (char)pcVar8;
        }
        memcpy((char *)((long)local_b8 + 1),local_b0,(size_t)pcVar33);
        iVar21 = (int)local_b8 + (int)pcVar33 + 1;
      }
      if (pcVar32 <= pcVar30) {
        return iVar21 - iVar23;
      }
      return 0;
    }
  }
  else {
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize != 0) {
        uVar31 = *(uint *)((long)state + 0x4010);
        pcVar30 = source + (uint)inputSize;
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4010) = uVar31 + inputSize;
        *(undefined4 *)((long)state + 0x4014) = 3;
        if (0xc < inputSize) {
          lVar18 = (long)source - (ulong)uVar31;
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar31;
          piVar25 = (int *)(source + 1);
          local_98 = (ulong)((uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13);
          psVar27 = (short *)dest;
          pcVar32 = pcVar30;
          piVar13 = (int *)source;
          do {
            uVar22 = 1;
            uVar31 = iVar9 << 6;
            do {
              piVar7 = piVar25;
              piVar25 = (int *)(uVar22 + (long)piVar7);
              sVar4 = (short)lVar18;
              if (source + ((ulong)(uint)inputSize - 0xb) < piVar25) {
                iVar21 = 2;
              }
              else {
                uVar22 = (ulong)*(ushort *)((long)state + local_98 * 2);
                iVar5 = *piVar25;
                *(short *)((long)state + local_98 * 2) = (short)piVar7 - sVar4;
                iVar21 = 7;
                if (*(int *)(lVar18 + uVar22) != *piVar7) {
                  iVar21 = 0;
                }
                pcVar32 = (char *)(uVar22 + lVar18);
                local_98 = (ulong)((uint)(iVar5 * -0x61c8864f) >> 0x13);
              }
              uVar22 = (ulong)(uVar31 >> 6);
              uVar31 = uVar31 + 1;
            } while (iVar21 == 0);
            if (iVar21 == 7) {
              iVar21 = 0;
            }
            dest = (char *)psVar27;
            piVar25 = piVar7;
            if (iVar21 == 0) {
              if ((source < pcVar32) &&
                 (pcVar33 = pcVar32, *(char *)((long)piVar7 + -1) == pcVar32[-1])) {
                while( true ) {
                  pcVar32 = pcVar33 + -1;
                  piVar7 = (int *)((long)piVar25 + -1);
                  if (pcVar32 <= source) break;
                  if ((piVar7 <= piVar13) ||
                     (pcVar8 = (char *)((long)piVar25 + -2), pcVar2 = pcVar33 + -2, piVar25 = piVar7
                     , pcVar33 = pcVar32, *pcVar8 != *pcVar2)) break;
                }
              }
              uVar22 = (long)piVar7 - (long)piVar13;
              __s = (short *)((long)psVar27 + 1);
              if ((uint)uVar22 < 0xf) {
                *(char *)psVar27 = (char)uVar22 << 4;
              }
              else {
                uVar31 = (uint)uVar22 - 0xf;
                *(char *)psVar27 = -0x10;
                if (0xfe < uVar31) {
                  memset(__s,0xff,(ulong)(uint)(((int)piVar7 + -0x10e) - (int)piVar13) / 0xff + 1);
                  iVar21 = (int)piVar7 - (int)piVar13;
                  uVar31 = iVar21 - 0x10e;
                  __s = (short *)((long)psVar27 + (ulong)uVar31 / 0xff + 2);
                  uVar31 = (iVar21 + (uVar31 / 0xff) * -0xff) - 0x10e;
                }
                *(char *)__s = (char)uVar31;
                __s = (short *)((long)__s + 1);
              }
              psVar20 = (short *)((uVar22 & 0xffffffff) + (long)__s);
              do {
                *(undefined8 *)__s = *(undefined8 *)piVar13;
                __s = __s + 4;
                piVar13 = piVar13 + 2;
              } while (__s < psVar20);
              do {
                *psVar20 = (short)piVar7 - (short)pcVar32;
                puVar1 = (ulong *)(piVar7 + 1);
                puVar19 = (ulong *)(pcVar32 + 4);
                puVar15 = puVar1;
                if (puVar1 < pcVar30 + -0xc) {
                  uVar14 = *(ulong *)(piVar7 + 1) ^ *(ulong *)(pcVar32 + 4);
                  uVar22 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                  puVar15 = (ulong *)(piVar7 + 3);
                  puVar19 = (ulong *)(pcVar32 + 0xc);
                  if (*(ulong *)(pcVar32 + 4) == *(ulong *)(piVar7 + 1)) goto LAB_0014eebb;
                }
                else {
LAB_0014eebb:
                  do {
                    if (pcVar30 + -0xc <= puVar15) {
                      if ((puVar15 < pcVar30 + -8) && ((int)*puVar19 == (int)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 4);
                        puVar19 = (ulong *)((long)puVar19 + 4);
                      }
                      if ((puVar15 < pcVar30 + -6) && ((short)*puVar19 == (short)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 2);
                        puVar19 = (ulong *)((long)puVar19 + 2);
                      }
                      if (puVar15 < source + ((ulong)(uint)inputSize - 5)) {
                        puVar15 = (ulong *)((long)puVar15 +
                                           (ulong)((char)*puVar19 == (char)*puVar15));
                      }
                      uVar22 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                      goto LAB_0014eef6;
                    }
                    uVar22 = *puVar19;
                    uVar14 = *puVar15;
                    uVar29 = uVar14 ^ uVar22;
                    uVar11 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    iVar21 = (int)puVar15;
                    puVar19 = puVar19 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar22 == uVar14);
                  uVar22 = (ulong)((((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21) - (int)puVar1);
                }
LAB_0014eef6:
                dest = (char *)(psVar20 + 1);
                uVar31 = (uint)uVar22;
                if (uVar31 < 0xf) {
                  *(char *)psVar27 = (char)*psVar27 + (char)uVar22;
                }
                else {
                  *(char *)psVar27 = (char)*psVar27 + '\x0f';
                  uVar16 = uVar31 - 0xf;
                  *(short *)((long)dest + 0) = -1;
                  *(short *)((long)dest + 2) = -1;
                  if (0x3fb < uVar16) {
                    uVar31 = uVar31 - 0x40b;
                    memset(psVar20 + 3,0xff,(ulong)((uVar31 / 0x3fc) * 4 + 4));
                    uVar16 = uVar31 % 0x3fc;
                    dest = (char *)((long)psVar20 + (ulong)((uVar31 / 0x3fc) * 4) + 6);
                  }
                  pcVar33 = (char *)((long)dest + (ulong)uVar16 / 0xff);
                  dest = pcVar33 + 1;
                  *pcVar33 = (char)(uVar16 / 0xff) + (char)uVar16;
                }
                lVar24 = (long)piVar7 + uVar22;
                piVar13 = (int *)(lVar24 + 4);
                if (source + ((ulong)(uint)inputSize - 0xb) <= piVar13) {
                  iVar21 = 3;
                  piVar25 = piVar13;
                  goto LAB_0014f09b;
                }
                *(short *)((long)state +
                          (ulong)((uint)(*(int *)(lVar24 + 2) * -0x61c8864f) >> 0x13) * 2) =
                     ((short)lVar24 + 2) - sVar4;
                iVar21 = *piVar13;
                uVar22 = (ulong)((uint)(iVar21 * -0x61c8864f) >> 0x13);
                uVar14 = (ulong)*(ushort *)((long)state + uVar22 * 2);
                *(short *)((long)state + uVar22 * 2) = (short)piVar13 - sVar4;
                iVar5 = *(int *)(lVar18 + uVar14);
                psVar20 = (short *)dest;
                if (iVar5 == iVar21) {
                  *dest = '\0';
                  psVar20 = (short *)((long)dest + 1);
                  psVar27 = (short *)dest;
                }
                pcVar32 = (char *)(uVar14 + lVar18);
                piVar7 = piVar13;
              } while (iVar5 == iVar21);
              local_98 = (ulong)((uint)(*(int *)(lVar24 + 5) * -0x61c8864f) >> 0x13);
              iVar21 = 0;
              dest = (char *)psVar20;
              piVar25 = (int *)(lVar24 + 5);
            }
LAB_0014f09b:
            psVar27 = (short *)dest;
          } while (iVar21 == 0);
          source = (char *)piVar13;
          if (1 < iVar21 - 2U) {
            return 0;
          }
        }
        uVar22 = (long)pcVar30 - (long)source;
        if (uVar22 < 0xf) {
          *dest = (char)uVar22 << 4;
        }
        else {
          uVar14 = uVar22 - 0xf;
          *dest = -0x10;
          psVar27 = (short *)((long)dest + 1);
          if (0xfe < uVar14) {
            uVar14 = (uVar22 - 0x10e) / 0xff;
            memset(psVar27,0xff,uVar14 + 1);
            psVar27 = (short *)((long)dest + uVar14 + 2);
            uVar14 = (uVar22 + uVar14 * -0xff) - 0x10e;
          }
          *(char *)psVar27 = (char)uVar14;
          dest = (char *)psVar27;
        }
        memcpy((char *)((long)dest + 1),source,uVar22);
        return ((int)(char *)((long)dest + 1) + (int)uVar22) - iVar23;
      }
      goto LAB_0014e74a;
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    uVar31 = *(uint *)((long)state + 0x4010);
    lVar18 = (long)source - (ulong)uVar31;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    *(uint *)((long)state + 0x4010) = inputSize + uVar31;
    *(undefined4 *)((long)state + 0x4014) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar31;
    plVar6 = (long *)(source + 1);
    uVar22 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
    plVar10 = (long *)source;
    do {
      uVar16 = 1;
      uVar31 = iVar9 << 6;
      while( true ) {
        plVar12 = (long *)((ulong)uVar16 + (long)plVar6);
        iVar21 = (int)lVar18;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar12) {
          iVar5 = 2;
        }
        else {
          uVar16 = *(uint *)((long)state + uVar22 * 4);
          uVar26 = (int)plVar6 - iVar21;
          unaff_R15 = (int *)((ulong)uVar16 + lVar18);
          uVar14 = (ulong)(*plVar12 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)state + uVar22 * 4) = uVar26;
          iVar5 = 8;
          uVar22 = uVar14;
          if ((uVar26 <= uVar16 + 0xffff) && (iVar5 = 7, *unaff_R15 != (int)*plVar6)) {
            iVar5 = 0;
          }
        }
        if ((iVar5 != 0) && (iVar5 != 8)) break;
        uVar16 = uVar31 >> 6;
        uVar31 = uVar31 + 1;
        plVar6 = plVar12;
      }
      if (iVar5 == 7) {
        iVar5 = 0;
      }
      plVar12 = (long *)dest;
      if (iVar5 == 0) {
        if ((source < unaff_R15) &&
           (plVar12 = plVar6, piVar25 = unaff_R15,
           *(char *)((long)plVar6 + -1) == *(char *)((long)unaff_R15 + -1))) {
          while( true ) {
            unaff_R15 = (int *)((long)piVar25 + -1);
            plVar6 = (long *)((long)plVar12 + -1);
            if (unaff_R15 <= source) break;
            if ((plVar6 <= plVar10) ||
               (pcVar30 = (char *)((long)plVar12 + -2), pcVar32 = (char *)((long)piVar25 + -2),
               plVar12 = plVar6, piVar25 = unaff_R15, *pcVar30 != *pcVar32)) break;
          }
        }
        uVar14 = (long)plVar6 - (long)plVar10;
        plVar12 = (long *)((long)dest + 1);
        if ((uint)uVar14 < 0xf) {
          *dest = (char)uVar14 << 4;
        }
        else {
          uVar31 = (uint)uVar14 - 0xf;
          *dest = -0x10;
          if (0xfe < uVar31) {
            memset(plVar12,0xff,(ulong)(uint)(((int)plVar6 + -0x10e) - (int)plVar10) / 0xff + 1);
            iVar5 = (int)plVar6 - (int)plVar10;
            uVar31 = iVar5 - 0x10e;
            plVar12 = (long *)((long)dest + (ulong)uVar31 / 0xff + 2);
            uVar31 = (iVar5 + (uVar31 / 0xff) * -0xff) - 0x10e;
          }
          *(char *)plVar12 = (char)uVar31;
          plVar12 = (long *)((long)plVar12 + 1);
        }
        plVar17 = (long *)((uVar14 & 0xffffffff) + (long)plVar12);
        do {
          *plVar12 = *plVar10;
          plVar12 = plVar12 + 1;
          plVar10 = plVar10 + 1;
        } while (plVar12 < plVar17);
        do {
          *(short *)plVar17 = (short)plVar6 - (short)unaff_R15;
          puVar1 = (ulong *)((long)plVar6 + 4);
          puVar15 = (ulong *)(unaff_R15 + 1);
          puVar19 = puVar1;
          if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
            uVar11 = *(ulong *)((long)plVar6 + 4) ^ *(ulong *)(unaff_R15 + 1);
            uVar14 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar14 = uVar14 >> 3 & 0x1fffffff;
            puVar19 = (ulong *)((long)plVar6 + 0xc);
            puVar15 = (ulong *)(unaff_R15 + 3);
            if (*(ulong *)(unaff_R15 + 1) == *(ulong *)((long)plVar6 + 4)) goto LAB_0014e47c;
          }
          else {
LAB_0014e47c:
            do {
              if (source + ((ulong)(uint)inputSize - 0xc) <= puVar19) {
                if ((puVar19 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar15 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar15 = (ulong *)((long)puVar15 + 4);
                }
                if ((puVar19 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar15 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar15 = (ulong *)((long)puVar15 + 2);
                }
                if (puVar19 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar15 == (char)*puVar19));
                }
                uVar14 = (ulong)(uint)((int)puVar19 - (int)puVar1);
                goto LAB_0014e4b9;
              }
              uVar14 = *puVar15;
              uVar11 = *puVar19;
              uVar28 = uVar11 ^ uVar14;
              uVar29 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              iVar5 = (int)puVar19;
              puVar15 = puVar15 + 1;
              puVar19 = puVar19 + 1;
            } while (uVar14 == uVar11);
            uVar14 = (ulong)((((uint)(uVar29 >> 3) & 0x1fffffff) + iVar5) - (int)puVar1);
          }
LAB_0014e4b9:
          plVar12 = (long *)((long)plVar17 + 2);
          uVar31 = (uint)uVar14;
          if (uVar31 < 0xf) {
            *dest = (char)*(long *)dest + (char)uVar14;
          }
          else {
            *dest = (char)*(long *)dest + '\x0f';
            uVar16 = uVar31 - 0xf;
            *(undefined4 *)plVar12 = 0xffffffff;
            if (0x3fb < uVar16) {
              uVar31 = uVar31 - 0x40b;
              memset((char *)((long)plVar17 + 6),0xff,(ulong)((uVar31 / 0x3fc) * 4 + 4));
              uVar16 = uVar31 % 0x3fc;
              plVar12 = (long *)((long)plVar17 + (ulong)((uVar31 / 0x3fc) * 4) + 6);
            }
            pcVar30 = (char *)((long)plVar12 + (ulong)uVar16 / 0xff);
            plVar12 = (long *)(pcVar30 + 1);
            *pcVar30 = (char)(uVar16 / 0xff) + (char)uVar16;
          }
          lVar24 = (long)plVar6 + uVar14;
          plVar10 = (long *)(lVar24 + 4);
          plVar6 = plVar10;
          if (source + ((ulong)(uint)inputSize - 0xb) <= plVar10) {
            iVar5 = 3;
            goto LAB_0014e61a;
          }
          *(int *)((long)state + ((ulong)(*(long *)(lVar24 + 2) * -0x30e4432345000000) >> 0x34) * 4)
               = ((int)lVar24 + 2) - iVar21;
          uVar14 = (ulong)(*plVar10 * -0x30e4432345000000) >> 0x34;
          uVar16 = (int)plVar10 - iVar21;
          uVar31 = *(uint *)((long)state + uVar14 * 4);
          unaff_R15 = (int *)((ulong)uVar31 + lVar18);
          *(uint *)((long)state + uVar14 * 4) = uVar16;
          bVar3 = true;
          plVar17 = plVar12;
          if ((uVar16 <= uVar31 + 0xffff) && (*unaff_R15 == *(int *)plVar10)) {
            *(char *)plVar12 = '\0';
            bVar3 = false;
            plVar17 = (long *)((long)plVar12 + 1);
            dest = (char *)plVar12;
          }
        } while (!bVar3);
        uVar22 = (ulong)(*(long *)(lVar24 + 5) * -0x30e4432345000000) >> 0x34;
        iVar5 = 0;
        plVar12 = plVar17;
        plVar6 = (long *)(lVar24 + 5);
      }
LAB_0014e61a:
      dest = (char *)plVar12;
    } while (iVar5 == 0);
    if (iVar5 - 2U < 2) {
      pcVar30 = source + ((ulong)(uint)inputSize - (long)plVar10);
      if (pcVar30 < (char *)0xf) {
        *(char *)plVar12 = (char)pcVar30 << 4;
      }
      else {
        pcVar32 = pcVar30 + -0xf;
        *(char *)plVar12 = -0x10;
        plVar6 = (long *)((long)plVar12 + 1);
        if ((char *)0xfe < pcVar32) {
          uVar22 = (ulong)(pcVar30 + -0x10e) / 0xff;
          memset(plVar6,0xff,uVar22 + 1);
          plVar6 = (long *)((long)plVar12 + uVar22 + 2);
          pcVar32 = pcVar30 + uVar22 * -0xff + -0x10e;
        }
        *(char *)plVar6 = (char)pcVar32;
        plVar12 = plVar6;
      }
      memcpy((char *)((long)plVar12 + 1),plVar10,(size_t)pcVar30);
      return ((int)(char *)((long)plVar12 + 1) + (int)pcVar30) - iVar23;
    }
  }
  return 0;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}